

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForJSON(QPDF *this,int id,int gen)

{
  long lVar1;
  size_type sVar2;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  _Base_ptr *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar3;
  shared_ptr<QPDFObject> sVar4;
  QPDFObjGen og;
  QPDFObjGen in_stack_ffffffffffffffd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pVar3 = std::
          map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::try_emplace<>((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                           *)(*(long *)CONCAT44(in_register_00000034,id) + 0x1a8),
                          (key_type *)&stack0xffffffffffffffd0);
  this_00 = &pVar3.first._M_node._M_node[1]._M_parent;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_001e8bef;
  lVar1 = *(long *)CONCAT44(in_register_00000034,id);
  if (*(char *)(lVar1 + 0x2d4) == '\x01') {
    sVar2 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                     *)(lVar1 + 0x138),(key_type *)&stack0xffffffffffffffd0);
    if (sVar2 != 0) goto LAB_001e8bc6;
    QPDFObject::create<QPDF_Null>((QPDF *)CONCAT44(in_ECX,gen),in_stack_ffffffffffffffd8);
  }
  else {
LAB_001e8bc6:
    QPDFObject::create<QPDF_Unresolved>((QPDF *)CONCAT44(in_ECX,gen),in_stack_ffffffffffffffd8);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
LAB_001e8bef:
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForJSON(int id, int gen)
{
    auto og = QPDFObjGen(id, gen);
    auto [it, inserted] = m->obj_cache.try_emplace(og);
    auto& obj = it->second.object;
    if (inserted) {
        obj = (m->parsed && !m->xref_table.count(og))
            ? QPDFObject::create<QPDF_Null>(this, og)
            : QPDFObject::create<QPDF_Unresolved>(this, og);
    }
    return obj;
}